

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::ClusterBlocks<brotli::Histogram<704>,unsigned_short>
               (unsigned_short *data,size_t length,uint8_t *block_ids)

{
  pointer *this;
  pointer *this_00;
  value_type vVar1;
  reference pvVar2;
  size_type num_blocks;
  bool bVar3;
  size_type local_bc0;
  size_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_symbols;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> clustered_histograms;
  size_type sStack_b80;
  bool block_boundary;
  size_t i;
  Histogram<704> cur_histogram;
  uint32_t cur_idx;
  allocator<unsigned_int> local_51;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> block_index;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> histograms;
  uint8_t *block_ids_local;
  size_t length_local;
  unsigned_short *data_local;
  
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::vector
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)
             &block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<unsigned_int>::allocator(&local_51);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,length,&local_51);
  std::allocator<unsigned_int>::~allocator(&local_51);
  cur_histogram.bit_cost_._0_4_ = 0;
  Histogram<704>::Histogram((Histogram<704> *)&i);
  for (sStack_b80 = 0; vVar1 = cur_histogram.bit_cost_._0_4_, sStack_b80 < length;
      sStack_b80 = sStack_b80 + 1) {
    bVar3 = true;
    if (sStack_b80 + 1 != length) {
      bVar3 = block_ids[sStack_b80] != block_ids[sStack_b80 + 1];
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sStack_b80);
    *pvVar2 = vVar1;
    Histogram<704>::Add((Histogram<704> *)&i,(ulong)data[sStack_b80]);
    if (bVar3) {
      std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::push_back
                ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)
                 &block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&i);
      Histogram<704>::Clear((Histogram<704> *)&i);
      cur_histogram.bit_cost_._0_4_ = cur_histogram.bit_cost_._0_4_ + 1;
    }
  }
  this_00 = &histogram_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::vector
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
  this = &block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  num_blocks = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::size
                         ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                           *)this);
  ClusterHistograms<brotli::Histogram<704>>
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)this,1,
             num_blocks,0x100,
             (vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)this_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
  for (local_bc0 = 0; local_bc0 < length; local_bc0 = local_bc0 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,local_bc0);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,(ulong)*pvVar2);
    block_ids[local_bc0] = (uint8_t)*pvVar2;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::~vector
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)
             &histogram_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::~vector
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)
             &block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ClusterBlocks(const DataType* data, const size_t length,
                   uint8_t* block_ids) {
  std::vector<HistogramType> histograms;
  std::vector<uint32_t> block_index(length);
  uint32_t cur_idx = 0;
  HistogramType cur_histogram;
  for (size_t i = 0; i < length; ++i) {
    bool block_boundary = (i + 1 == length || block_ids[i] != block_ids[i + 1]);
    block_index[i] = cur_idx;
    cur_histogram.Add(data[i]);
    if (block_boundary) {
      histograms.push_back(cur_histogram);
      cur_histogram.Clear();
      ++cur_idx;
    }
  }
  std::vector<HistogramType> clustered_histograms;
  std::vector<uint32_t> histogram_symbols;
  // Block ids need to fit in one byte.
  static const size_t kMaxNumberOfBlockTypes = 256;
  ClusterHistograms(histograms, 1, histograms.size(),
                    kMaxNumberOfBlockTypes,
                    &clustered_histograms,
                    &histogram_symbols);
  for (size_t i = 0; i < length; ++i) {
    block_ids[i] = static_cast<uint8_t>(histogram_symbols[block_index[i]]);
  }
}